

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O2

void CreateBackwardReferencesNH2
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals,
               BackwardReferenceFromDecoder *backward_references,size_t *back_refs_position,
               size_t back_refs_size)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  uint8_t uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  ushort uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  int iVar19;
  size_t sVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  char *pcVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  short sVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  uint uVar38;
  ulong uVar39;
  ulong uVar40;
  uint uVar41;
  ulong uVar42;
  ulong uVar43;
  bool bVar44;
  ulong local_120;
  ulong local_118;
  size_t *local_f0;
  ulong local_d0;
  ulong local_c8;
  ulong local_88;
  uint local_70;
  
  uVar15 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
  uVar4 = (position - 7) + num_bytes;
  sVar20 = position;
  if (7 < num_bytes) {
    sVar20 = uVar4;
  }
  lVar21 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar21 = 0x40;
  }
  uVar1 = position + num_bytes;
  lVar3 = position - 1;
  lVar6 = *(long *)(literal_context_lut + 0x10);
  local_d0 = *(ulong *)dist_cache;
  uVar17 = lVar21 + position;
  local_f0 = last_insert_len;
  do {
    while( true ) {
      uVar40 = position;
      if (uVar1 <= uVar40 + 8) {
        *(ulong *)dist_cache = (local_d0 + uVar1) - uVar40;
        *(long *)commands = *(long *)commands + ((long)local_f0 - (long)last_insert_len >> 4);
        return;
      }
      uVar32 = uVar1 - uVar40;
      uVar16 = uVar15;
      if (uVar40 < uVar15) {
        uVar16 = uVar40;
      }
      uVar37 = lVar6 + uVar40;
      if (uVar15 <= lVar6 + uVar40) {
        uVar37 = uVar15;
      }
      uVar7 = *(ulong *)(literal_context_lut + 0x50);
      lVar8 = *(long *)&(params->hasher).num_last_distances_to_check;
      uVar34 = uVar40 & ringbuffer_mask;
      piVar2 = (int *)(ringbuffer + uVar34);
      uVar5 = ringbuffer[uVar34];
      uVar34 = (ulong)(*(long *)(ringbuffer + uVar34) * -0x42e1ca5843000000) >> 0x30;
      local_118 = (ulong)*(int *)&(hasher->common).extra;
      local_70 = (uint)ringbuffer_mask;
      if ((uVar40 - local_118 < uVar40) &&
         (uVar31 = (ulong)((uint)(uVar40 - local_118) & local_70), uVar5 == ringbuffer[uVar31]))
      break;
LAB_0010ecde:
      uVar38 = *(uint *)(lVar8 + uVar34 * 4);
      *(int *)(lVar8 + uVar34 * 4) = (int)uVar40;
      uVar34 = (ulong)(local_70 & uVar38);
      if (((uVar5 == ringbuffer[uVar34]) && (uVar40 != uVar38)) &&
         (local_118 = uVar40 - uVar38, local_118 <= uVar16)) {
        uVar16 = uVar32 & 0xfffffffffffffff8;
        uVar31 = 0;
        lVar27 = 0;
LAB_0010ed2d:
        if (uVar32 >> 3 == uVar31) {
          uVar31 = (ulong)((uint)uVar32 & 7);
          for (; (bVar44 = uVar31 != 0, uVar31 = uVar31 - 1, uVar39 = uVar32, bVar44 &&
                 (uVar39 = uVar16,
                 ringbuffer[uVar16 + uVar34] == *(uint8_t *)((long)piVar2 + uVar16)));
              uVar16 = uVar16 + 1) {
          }
        }
        else {
          if (*(ulong *)(piVar2 + uVar31 * 2) == *(ulong *)(ringbuffer + uVar31 * 8 + uVar34))
          goto code_r0x0010ed48;
          uVar34 = *(ulong *)(ringbuffer + uVar31 * 8 + uVar34) ^ *(ulong *)(piVar2 + uVar31 * 2);
          uVar16 = 0;
          if (uVar34 != 0) {
            for (; (uVar34 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
            }
          }
          uVar39 = (uVar16 >> 3 & 0x1fffffff) - lVar27;
        }
        if (3 < uVar39) {
          iVar12 = 0x1f;
          if ((uint)local_118 != 0) {
            for (; (uint)local_118 >> iVar12 == 0; iVar12 = iVar12 + -1) {
            }
          }
          uVar31 = (ulong)(iVar12 * -0x1e + 0x780) + uVar39 * 0x87;
          if (0x7e4 < uVar31) goto LAB_0010f08e;
        }
        lVar27 = *(long *)&(params->hasher).block_bits;
        uVar16 = *(ulong *)(lVar27 + 8);
        local_120 = *(ulong *)(lVar27 + 0x10);
        if (uVar16 >> 7 <= local_120) {
          uVar34 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
          bVar44 = true;
          uVar31 = 0x7e4;
          iVar12 = 0;
          local_118 = 0;
          uVar39 = 0;
          while (bVar44) {
            uVar16 = uVar16 + 1;
            *(ulong *)(lVar27 + 8) = uVar16;
            bVar18 = *(byte *)(*(long *)(literal_context_lut + 0x78) + uVar34);
            uVar26 = (ulong)bVar18;
            if ((uVar26 != 0) && (uVar26 <= uVar32)) {
              uVar23 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar34 * 2);
              lVar9 = *(long *)(literal_context_lut + 0x58);
              lVar22 = uVar23 * uVar26 + *(long *)(lVar9 + 0xa8) +
                       (ulong)*(uint *)(lVar9 + 0x20 + uVar26 * 4);
              uVar35 = (ulong)(bVar18 & 0xfffffff8);
              uVar42 = 0;
LAB_0010ee43:
              if (uVar35 == uVar42) {
                uVar28 = (ulong)(bVar18 & 7);
                pcVar24 = (char *)(lVar22 + uVar42);
                for (; (bVar44 = uVar28 != 0, uVar28 = uVar28 - 1, uVar42 = uVar26, bVar44 &&
                       (uVar42 = uVar35, *(char *)((long)piVar2 + uVar35) == *pcVar24));
                    uVar35 = uVar35 + 1) {
                  pcVar24 = pcVar24 + 1;
                }
              }
              else {
                uVar28 = *(ulong *)(lVar22 + uVar42);
                if (uVar28 == *(ulong *)((long)piVar2 + uVar42)) goto code_r0x0010ee5e;
                uVar28 = *(ulong *)((long)piVar2 + uVar42) ^ uVar28;
                uVar35 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                uVar42 = (uVar35 >> 3 & 0x1fffffff) + uVar42;
              }
              if (((uVar42 != 0) && (uVar26 < *(uint *)(literal_context_lut + 100) + uVar42)) &&
                 (uVar26 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                                          ((char)(uVar26 - uVar42) * '\x06' & 0x3fU)) & 0x3f) +
                            (uVar26 - uVar42) * 4 << (*(byte *)(lVar9 + uVar26) & 0x3f)) +
                           uVar23 + uVar37 + 1, uVar26 <= uVar7)) {
                iVar19 = 0x1f;
                if ((uint)uVar26 != 0) {
                  for (; (uint)uVar26 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                  }
                }
                uVar23 = (uVar42 * 0x87 - (ulong)(uint)(iVar19 * 0x1e)) + 0x780;
                if (uVar31 <= uVar23) {
                  iVar12 = (uint)bVar18 - (int)uVar42;
                  local_120 = local_120 + 1;
                  *(ulong *)(lVar27 + 0x10) = local_120;
                  uVar31 = uVar23;
                  uVar39 = uVar42;
                  local_118 = uVar26;
                }
              }
            }
            uVar34 = uVar34 + 1;
            bVar44 = false;
          }
          if (0x7e4 < uVar31) goto LAB_0010f097;
        }
      }
      local_d0 = local_d0 + 1;
      position = uVar40 + 1;
      if ((num_literals == (size_t *)0x0) && (uVar17 < position)) {
        if (uVar17 + (uint)((int)lVar21 * 4) < position) {
          uVar16 = uVar40 + 0x11;
          if (uVar4 <= uVar40 + 0x11) {
            uVar16 = uVar4;
          }
          for (; position < uVar16; position = position + 4) {
            *(int *)(lVar8 + ((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) *
                                     -0x42e1ca5843000000) >> 0x30) * 4) = (int)position;
            local_d0 = local_d0 + 4;
          }
        }
        else {
          uVar16 = uVar40 + 9;
          if (uVar4 <= uVar40 + 9) {
            uVar16 = uVar4;
          }
          for (; position < uVar16; position = position + 2) {
            *(int *)(lVar8 + ((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) *
                                     -0x42e1ca5843000000) >> 0x30) * 4) = (int)position;
            local_d0 = local_d0 + 2;
          }
        }
      }
    }
    uVar26 = uVar32 & 0xfffffffffffffff8;
    uVar39 = 0;
    lVar27 = 0;
LAB_0010ec7d:
    if (uVar32 >> 3 == uVar39) {
      uVar23 = (ulong)((uint)uVar32 & 7);
      for (; (bVar44 = uVar23 != 0, uVar23 = uVar23 - 1, uVar39 = uVar32, bVar44 &&
             (uVar39 = uVar26, ringbuffer[uVar26 + uVar31] == *(uint8_t *)((long)piVar2 + uVar26)));
          uVar26 = uVar26 + 1) {
      }
    }
    else {
      if (*(ulong *)(piVar2 + uVar39 * 2) == *(ulong *)(ringbuffer + uVar39 * 8 + uVar31)) break;
      uVar26 = *(ulong *)(ringbuffer + uVar39 * 8 + uVar31) ^ *(ulong *)(piVar2 + uVar39 * 2);
      uVar31 = 0;
      if (uVar26 != 0) {
        for (; (uVar26 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
        }
      }
      uVar39 = (uVar31 >> 3 & 0x1fffffff) - lVar27;
    }
    if ((uVar39 < 4) || (uVar31 = uVar39 * 0x87 + 0x78f, uVar31 < 0x7e5)) goto LAB_0010ecde;
    *(int *)(lVar8 + uVar34 * 4) = (int)uVar40;
LAB_0010f08e:
    iVar12 = 0;
LAB_0010f097:
    uVar17 = (ulong)*(int *)&(hasher->common).extra;
    uVar16 = local_d0 + 4;
    uVar37 = (lVar3 + num_bytes) - uVar40;
    iVar19 = 0;
    do {
      uVar26 = (ulong)((uint)uVar37 & 7);
      uVar32 = uVar32 - 1;
      uVar34 = uVar39 - 1;
      if (uVar32 <= uVar39 - 1) {
        uVar34 = uVar32;
      }
      if (4 < *(int *)(literal_context_lut + 4)) {
        uVar34 = 0;
      }
      uVar23 = uVar40 + 1;
      uVar35 = uVar15;
      if (uVar23 < uVar15) {
        uVar35 = uVar23;
      }
      local_c8 = lVar6 + uVar40 + 1;
      if (uVar15 <= local_c8) {
        local_c8 = uVar15;
      }
      piVar2 = (int *)(ringbuffer + (uVar23 & ringbuffer_mask));
      uVar5 = *(uint8_t *)(uVar34 + (long)piVar2);
      uVar28 = (ulong)(*(long *)(ringbuffer + (uVar23 & ringbuffer_mask)) * -0x42e1ca5843000000) >>
               0x30;
      uVar42 = uVar23 - uVar17;
      if ((uVar42 < uVar23) &&
         (uVar38 = (uint)uVar42 & local_70, uVar5 == ringbuffer[uVar34 + uVar38])) {
        uVar42 = 0;
        lVar27 = 0;
LAB_0010f189:
        if (uVar37 >> 3 == uVar42) {
          uVar29 = uVar26;
          for (uVar42 = -lVar27;
              (bVar44 = uVar29 != 0, uVar29 = uVar29 - 1, bVar44 &&
              (ringbuffer[uVar42 + uVar38] == *(uint8_t *)((long)piVar2 + uVar42)));
              uVar42 = uVar42 + 1) {
          }
        }
        else {
          if (*(ulong *)(piVar2 + uVar42 * 2) == *(ulong *)(ringbuffer + uVar42 * 8 + (ulong)uVar38)
             ) goto code_r0x0010f1a4;
          uVar29 = *(ulong *)(ringbuffer + uVar42 * 8 + (ulong)uVar38) ^
                   *(ulong *)(piVar2 + uVar42 * 2);
          uVar42 = 0;
          if (uVar29 != 0) {
            for (; (uVar29 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
            }
          }
          uVar42 = (uVar42 >> 3 & 0x1fffffff) - lVar27;
        }
        if ((uVar42 < 4) || (uVar29 = uVar42 * 0x87 + 0x78f, uVar29 < 0x7e5)) goto LAB_0010f21c;
        *(int *)(lVar8 + uVar28 * 4) = (int)uVar23;
        iVar13 = 0;
        uVar34 = uVar17;
      }
      else {
LAB_0010f21c:
        uVar38 = *(uint *)(lVar8 + uVar28 * 4);
        *(int *)(lVar8 + uVar28 * 4) = (int)uVar23;
        uVar14 = local_70 & uVar38;
        uVar29 = 0x7e4;
        if (uVar5 == ringbuffer[uVar34 + uVar14]) {
          iVar13 = 0;
          if ((uVar23 != uVar38) && (uVar34 = uVar23 - uVar38, uVar34 <= uVar35)) {
            uVar35 = 0;
            lVar27 = 0;
LAB_0010f276:
            if (uVar37 >> 3 == uVar35) {
              for (uVar42 = -lVar27;
                  (bVar44 = uVar26 != 0, uVar26 = uVar26 - 1, bVar44 &&
                  (ringbuffer[uVar42 + uVar14] == *(uint8_t *)((long)piVar2 + uVar42)));
                  uVar42 = uVar42 + 1) {
              }
            }
            else {
              if (*(ulong *)(piVar2 + uVar35 * 2) ==
                  *(ulong *)(ringbuffer + uVar35 * 8 + (ulong)uVar14)) goto code_r0x0010f291;
              uVar35 = *(ulong *)(ringbuffer + uVar35 * 8 + (ulong)uVar14) ^
                       *(ulong *)(piVar2 + uVar35 * 2);
              uVar26 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              uVar42 = (uVar26 >> 3 & 0x1fffffff) - lVar27;
            }
            if (3 < uVar42) {
              iVar10 = 0x1f;
              if ((uint)uVar34 != 0) {
                for (; (uint)uVar34 >> iVar10 == 0; iVar10 = iVar10 + -1) {
                }
              }
              uVar29 = (ulong)(iVar10 * -0x1e + 0x780) + uVar42 * 0x87;
              if (0x7e4 < uVar29) goto LAB_0010f515;
            }
            lVar27 = *(long *)&(params->hasher).block_bits;
            uVar26 = *(ulong *)(lVar27 + 8);
            local_88 = *(ulong *)(lVar27 + 0x10);
            if (uVar26 >> 7 <= local_88) {
              uVar35 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
              bVar44 = true;
              uVar29 = 0x7e4;
              iVar13 = 0;
              uVar34 = 0;
              uVar42 = 0;
              while (bVar44) {
                uVar26 = uVar26 + 1;
                *(ulong *)(lVar27 + 8) = uVar26;
                bVar18 = *(byte *)(*(long *)(literal_context_lut + 0x78) + uVar35);
                uVar28 = (ulong)bVar18;
                if ((uVar28 != 0) && (uVar28 <= uVar32)) {
                  uVar36 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar35 * 2);
                  lVar9 = *(long *)(literal_context_lut + 0x58);
                  lVar22 = uVar36 * uVar28 + *(long *)(lVar9 + 0xa8) +
                           (ulong)*(uint *)(lVar9 + 0x20 + uVar28 * 4);
                  uVar25 = (ulong)(bVar18 & 0xfffffff8);
                  uVar43 = 0;
LAB_0010f3d5:
                  if (uVar25 == uVar43) {
                    uVar30 = (ulong)(bVar18 & 7);
                    pcVar24 = (char *)(lVar22 + uVar43);
                    for (; (bVar44 = uVar30 != 0, uVar30 = uVar30 - 1, uVar43 = uVar28, bVar44 &&
                           (uVar43 = uVar25, *(char *)((long)piVar2 + uVar25) == *pcVar24));
                        uVar25 = uVar25 + 1) {
                      pcVar24 = pcVar24 + 1;
                    }
                  }
                  else {
                    uVar30 = *(ulong *)(lVar22 + uVar43);
                    if (uVar30 == *(ulong *)((long)piVar2 + uVar43)) goto code_r0x0010f3f0;
                    uVar30 = *(ulong *)((long)piVar2 + uVar43) ^ uVar30;
                    uVar25 = 0;
                    if (uVar30 != 0) {
                      for (; (uVar30 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                      }
                    }
                    uVar43 = (uVar25 >> 3 & 0x1fffffff) + uVar43;
                  }
                  if (((uVar43 != 0) && (uVar28 < *(uint *)(literal_context_lut + 100) + uVar43)) &&
                     (uVar28 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                                              ((char)(uVar28 - uVar43) * '\x06' & 0x3fU)) & 0x3f) +
                                (uVar28 - uVar43) * 4 << (*(byte *)(lVar9 + uVar28) & 0x3f)) +
                               uVar36 + local_c8 + 1, uVar28 <= uVar7)) {
                    iVar10 = 0x1f;
                    if ((uint)uVar28 != 0) {
                      for (; (uint)uVar28 >> iVar10 == 0; iVar10 = iVar10 + -1) {
                      }
                    }
                    uVar25 = (uVar43 * 0x87 - (ulong)(uint)(iVar10 * 0x1e)) + 0x780;
                    if (uVar29 <= uVar25) {
                      iVar13 = (uint)bVar18 - (int)uVar43;
                      local_88 = local_88 + 1;
                      *(ulong *)(lVar27 + 0x10) = local_88;
                      uVar29 = uVar25;
                      uVar42 = uVar43;
                      uVar34 = uVar28;
                    }
                  }
                }
                uVar35 = uVar35 + 1;
                bVar44 = false;
              }
              goto LAB_0010f515;
            }
          }
          iVar13 = 0;
          uVar29 = 0x7e4;
          uVar34 = 0;
          uVar42 = 0;
        }
        else {
          iVar13 = 0;
          uVar34 = 0;
          uVar42 = 0;
        }
      }
LAB_0010f515:
      if (uVar29 < uVar31 + 0xaf) {
        uVar42 = uVar39;
        uVar23 = uVar40;
        uVar34 = local_118;
        iVar13 = iVar12;
        uVar26 = local_d0;
        local_c8 = uVar40 + lVar6;
        if (uVar15 <= uVar40 + lVar6) {
          local_c8 = uVar15;
        }
        break;
      }
      uVar26 = uVar16;
      if (iVar19 == 3) break;
      local_d0 = local_d0 + 1;
      iVar19 = iVar19 + 1;
      uVar35 = uVar40 + 9;
      uVar37 = uVar37 - 1;
      uVar31 = uVar29;
      uVar40 = uVar23;
      uVar39 = uVar42;
      local_118 = uVar34;
      uVar26 = local_d0;
      iVar12 = iVar13;
    } while (uVar35 < uVar1);
    local_d0 = uVar26;
    if (local_c8 < uVar34) {
LAB_0010f62d:
      uVar40 = uVar34 + 0xf;
LAB_0010f631:
      if ((uVar34 <= local_c8) && (uVar40 != 0)) {
        *(int *)((long)&(hasher->common).dict_num_lookups + 4) =
             (int)(hasher->common).dict_num_lookups;
        *(void **)((long)&(hasher->common).extra + 4) = (hasher->common).extra;
        *(int *)&(hasher->common).extra = (int)uVar34;
      }
    }
    else {
      uVar17 = (ulong)*(int *)&(hasher->common).extra;
      if (uVar34 != uVar17) {
        uVar16 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
        uVar40 = 1;
        if (uVar34 != uVar16) {
          uVar17 = (uVar34 + 3) - uVar17;
          if (uVar17 < 7) {
            bVar18 = (byte)((int)uVar17 << 2);
            uVar38 = 0x9750468;
          }
          else {
            uVar16 = (uVar34 + 3) - uVar16;
            if (6 < uVar16) {
              uVar40 = 2;
              if ((uVar34 != (long)(int)(hasher->common).dict_num_lookups) &&
                 (uVar40 = 3, uVar34 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4)
                 )) goto LAB_0010f62d;
              goto LAB_0010f631;
            }
            bVar18 = (byte)((int)uVar16 << 2);
            uVar38 = 0xfdb1ace;
          }
          uVar40 = (ulong)(uVar38 >> (bVar18 & 0x1f) & 0xf);
        }
        goto LAB_0010f631;
      }
      uVar40 = 0;
    }
    uVar14 = (uint)local_d0;
    *(uint *)local_f0 = uVar14;
    *(uint *)((long)local_f0 + 4) = iVar13 << 0x19 | (uint)uVar42;
    uVar17 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
    uVar38 = 0;
    if (uVar17 <= uVar40) {
      bVar18 = (byte)*(uint *)(literal_context_lut + 0x40);
      uVar16 = ((4L << (bVar18 & 0x3f)) + (uVar40 - *(uint *)(literal_context_lut + 0x44))) - 0x10;
      uVar38 = 0x1f;
      uVar41 = (uint)uVar16;
      if (uVar41 != 0) {
        for (; uVar41 >> uVar38 == 0; uVar38 = uVar38 - 1) {
        }
      }
      uVar38 = (uVar38 ^ 0xffffffe0) + 0x1f;
      uVar32 = (ulong)((uVar16 >> ((ulong)uVar38 & 0x3f) & 1) != 0);
      lVar27 = (ulong)uVar38 - (ulong)*(uint *)(literal_context_lut + 0x40);
      uVar40 = (~(-1 << (bVar18 & 0x1f)) & uVar41) + uVar17 +
               (uVar32 + lVar27 * 2 + 0xfffe << (bVar18 & 0x3f)) | lVar27 * 0x400;
      uVar38 = (uint)(uVar16 - (uVar32 + 2 << ((byte)uVar38 & 0x3f)) >> (bVar18 & 0x3f));
    }
    *(short *)((long)local_f0 + 0xe) = (short)uVar40;
    *(uint *)(local_f0 + 1) = uVar38;
    if (5 < local_d0) {
      if (local_d0 < 0x82) {
        uVar38 = 0x1f;
        uVar14 = (uint)(local_d0 - 2);
        if (uVar14 != 0) {
          for (; uVar14 >> uVar38 == 0; uVar38 = uVar38 - 1) {
          }
        }
        uVar14 = (int)(local_d0 - 2 >> ((char)(uVar38 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                 (uVar38 ^ 0xffffffe0) * 2 + 0x40;
      }
      else if (local_d0 < 0x842) {
        uVar38 = 0x1f;
        if (uVar14 - 0x42 != 0) {
          for (; uVar14 - 0x42 >> uVar38 == 0; uVar38 = uVar38 - 1) {
          }
        }
        uVar14 = (uVar38 ^ 0xffe0) + 0x2a;
      }
      else {
        uVar14 = 0x15;
        if (0x1841 < local_d0) {
          uVar14 = (uint)(ushort)(0x17 - (local_d0 < 0x5842));
        }
      }
    }
    uVar38 = iVar13 + (uint)uVar42;
    if (uVar38 < 10) {
      uVar41 = uVar38 - 2;
    }
    else if (uVar38 < 0x86) {
      uVar38 = uVar38 - 6;
      uVar41 = 0x1f;
      if (uVar38 != 0) {
        for (; uVar38 >> uVar41 == 0; uVar41 = uVar41 - 1) {
        }
      }
      uVar41 = (uVar38 >> ((char)(uVar41 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar41 ^ 0xffffffe0) * 2
               + 0x42;
    }
    else {
      uVar41 = 0x17;
      if (uVar38 < 0x846) {
        uVar41 = 0x1f;
        if (uVar38 - 0x46 != 0) {
          for (; uVar38 - 0x46 >> uVar41 == 0; uVar41 = uVar41 - 1) {
          }
        }
        uVar41 = (uVar41 ^ 0xffe0) + 0x2c;
      }
    }
    uVar11 = (ushort)uVar41;
    sVar33 = (uVar11 & 7) + ((ushort)uVar14 & 7) * 8;
    if ((((uVar40 & 0x3ff) == 0) && ((ushort)uVar14 < 8)) && (uVar11 < 0x10)) {
      if (7 < uVar11) {
        sVar33 = sVar33 + 0x40;
      }
    }
    else {
      iVar12 = ((uVar14 & 0xffff) >> 3) * 3 + ((uVar41 & 0xffff) >> 3);
      sVar33 = sVar33 + ((ushort)(0x520d40 >> ((char)iVar12 * '\x02' & 0x1fU)) & 0xc0) +
                        (short)iVar12 * 0x40 + 0x40;
    }
    *(short *)((long)local_f0 + 0xc) = sVar33;
    *num_commands = *num_commands + local_d0;
    position = uVar23 + uVar42;
    uVar40 = sVar20;
    if (position < sVar20) {
      uVar40 = position;
    }
    uVar16 = uVar23 + 2;
    if (uVar34 < uVar42 >> 2) {
      uVar17 = position + uVar34 * -4;
      if (uVar17 < uVar16) {
        uVar17 = uVar16;
      }
      uVar16 = uVar17;
      if (uVar40 < uVar17) {
        uVar16 = uVar40;
      }
    }
    uVar17 = uVar23 + lVar21 + uVar42 * 2;
    local_f0 = local_f0 + 2;
    for (; uVar16 < uVar40; uVar16 = uVar16 + 1) {
      *(int *)(lVar8 + ((ulong)(*(long *)(ringbuffer + (uVar16 & ringbuffer_mask)) *
                               -0x42e1ca5843000000) >> 0x30) * 4) = (int)uVar16;
    }
    local_d0 = 0;
  } while( true );
  lVar27 = lVar27 + -8;
  uVar39 = uVar39 + 1;
  goto LAB_0010ec7d;
code_r0x0010ed48:
  lVar27 = lVar27 + -8;
  uVar31 = uVar31 + 1;
  goto LAB_0010ed2d;
code_r0x0010ee5e:
  uVar42 = uVar42 + 8;
  goto LAB_0010ee43;
code_r0x0010f1a4:
  lVar27 = lVar27 + -8;
  uVar42 = uVar42 + 1;
  goto LAB_0010f189;
code_r0x0010f291:
  lVar27 = lVar27 + -8;
  uVar35 = uVar35 + 1;
  goto LAB_0010f276;
code_r0x0010f3f0:
  uVar43 = uVar43 + 8;
  goto LAB_0010f3d5;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}